

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

cmUVProcessChainBuilder * __thiscall
cmUVProcessChainBuilder::SetExternalStream(cmUVProcessChainBuilder *this,Stream stdio,int fd)

{
  reference pvVar1;
  value_type *streamData;
  int fd_local;
  Stream stdio_local;
  cmUVProcessChainBuilder *this_local;
  
  if (stdio < (Stream_ERROR|Stream_OUTPUT)) {
    pvVar1 = std::array<cmUVProcessChainBuilder::StdioConfiguration,_3UL>::operator[]
                       (&this->Stdio,(ulong)stdio);
    pvVar1->Type = External;
    pvVar1->FileDescriptor = fd;
  }
  return this;
}

Assistant:

cmUVProcessChainBuilder& cmUVProcessChainBuilder::SetExternalStream(
  Stream stdio, int fd)
{
  switch (stdio) {
    case Stream_INPUT:
    case Stream_OUTPUT:
    case Stream_ERROR: {
      auto& streamData = this->Stdio[stdio];
      streamData.Type = External;
      streamData.FileDescriptor = fd;
      break;
    }
  }
  return *this;
}